

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O0

void anon_unknown.dwarf_a3d2::do_encode_decode_test<long>(long ekey)

{
  bool bVar1;
  char *pcVar2;
  int64_t in_RDI;
  AssertionResult gtest_ar_1;
  long akey;
  key_decoder dec;
  AssertionResult gtest_ar;
  key_view kv;
  key_encoder enc;
  AssertHelper local_1f8;
  Message local_1f0;
  AssertionResult local_1e8;
  int64_t local_1d8;
  pointer local_1d0;
  size_t sStack_1c8;
  key_decoder local_1b8;
  AssertHelper local_1a0;
  Message local_198;
  unsigned_long local_190;
  size_type local_188;
  AssertionResult local_180;
  key_view local_170 [2];
  undefined1 local_150 [32];
  undefined1 local_130 [32];
  undefined1 local_110 [32];
  undefined1 local_f0 [32];
  undefined1 local_d0 [32];
  undefined1 local_b0 [32];
  undefined1 local_90 [32];
  undefined1 auStack_70 [24];
  byte local_58 [8];
  undefined1 auStack_50 [24];
  int64_t local_38 [6];
  
  auStack_70._0_16_ = ZEXT816(0) << 0x40;
  auStack_50 = ZEXT824(0);
  local_d0 = ZEXT1632(auStack_70._0_16_);
  auStack_70._16_8_ = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_150 = ZEXT1632(auStack_70._0_16_);
  local_130 = local_150;
  local_110 = local_150;
  local_f0 = local_150;
  local_b0 = local_d0;
  local_90 = local_d0;
  local_38[0] = in_RDI;
  unodb::key_encoder::key_encoder((key_encoder *)local_150);
  unodb::key_encoder::encode((key_encoder *)local_150,local_38[0]);
  local_170[0] = unodb::key_encoder::get_key_view((key_encoder *)local_150);
  local_188 = std::span<const_std::byte,_18446744073709551615UL>::size_bytes(local_170);
  local_190 = 8;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)&local_180,"(kv.size_bytes())","(sizeof(ekey))",&local_188,&local_190);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar2 = testing::AssertionResult::failure_message(&local_180);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0x92,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult(&local_180);
  local_1d0 = local_170[0]._M_ptr;
  sStack_1c8 = local_170[0]._M_extent._M_extent_value;
  unodb::key_decoder::key_decoder(&local_1b8,local_170[0]);
  unodb::key_decoder::decode(&local_1b8,&local_1d8);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)&local_1e8,"(akey)","(ekey)",&local_1d8,local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f0);
    pcVar2 = testing::AssertionResult::failure_message(&local_1e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0x97,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult(&local_1e8);
  unodb::key_encoder::~key_encoder((key_encoder *)local_150);
  return;
}

Assistant:

void do_encode_decode_test(const T ekey) {
  unodb::key_encoder enc{};
  enc.encode(ekey);
  const unodb::key_view kv = enc.get_key_view();   // encode
  UNODB_EXPECT_EQ(kv.size_bytes(), sizeof(ekey));  // check size
  // decode check
  unodb::key_decoder dec{kv};
  T akey;
  dec.decode(akey);
  UNODB_EXPECT_EQ(akey, ekey);
}